

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::dimpl::
subnet_wrapper<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_true,_void>
::subnet_wrapper(subnet_wrapper<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_true,_void>
                 *this,add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>
                       *l_,uint param_2)

{
  add_tag_layer<1UL,_dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>
  *l__00;
  uint uVar1;
  
  this->l = l_;
  l__00 = (l_->subnetwork)._M_t.super___uniq_ptr_impl<_b5ca7644_>._M_t.super__Tuple_impl<_654392d7_>
          .
          super__Head_base<0UL,_dlib::add_tag_layer<1UL,_dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>_*,_false>
          ._M_head_impl;
  add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  ::sample_expansion_factor
            (*(add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
               **)(*(long *)((long)(((((unique_ptr<_a7e97ea0_> *)
                                      ((long)&(l__00->subnetwork).subnetwork + 0xa0))->_M_t).
                                     super___uniq_ptr_impl<_a7e97ea0_>._M_t.
                                     super__Tuple_impl<_3ad593b3_>.
                                     super__Head_base<0UL,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>_*,_false>
                                    ._M_head_impl)->subnetwork)._M_t.
                                   super___uniq_ptr_impl<_a897d478_> + 0xc0) + 0x3c0));
  (this->subnetwork).l = l__00;
  uVar1 = add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
          ::sample_expansion_factor
                    (*(add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
                       **)(*(long *)((long)(((((unique_ptr<_a7e97ea0_> *)
                                              ((long)&(l__00->subnetwork).subnetwork + 0xa0))->_M_t)
                                             .super___uniq_ptr_impl<_a7e97ea0_>._M_t.
                                             super__Tuple_impl<_3ad593b3_>.
                                             super__Head_base<0UL,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>_*,_false>
                                            ._M_head_impl)->subnetwork)._M_t.
                                           super___uniq_ptr_impl<_a897d478_> + 0xc0) + 0x3c0));
  subnet_wrapper<dlib::repeat<5UL,_resnet::def<dlib::bn_con>::resbottleneck_256,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_false,_void>
  ::subnet_wrapper(&(this->subnetwork).subnetwork,&l__00->subnetwork,uVar1);
  return;
}

Assistant:

subnet_wrapper(T& l_, unsigned int = 0) : l(l_),subnetwork(l.subnet(), l.sample_expansion_factor()) {}